

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

void __thiscall
pbrt::VisibleSurface::VisibleSurface
          (VisibleSurface *this,SurfaceInteraction *si,CameraTransform *cameraTransform,
          SampledSpectrum *albedo,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  Point3f PVar10;
  Point3<float> PVar11;
  Vector3<float> VVar12;
  Normal3<float> NVar13;
  Transform cameraFromRender;
  Tuple3<pbrt::Normal3,_float> local_c8;
  Tuple3<pbrt::Point3,_float> local_b8;
  Transform local_a8;
  undefined1 auVar9 [56];
  
  this->set = false;
  (this->p).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (this->p).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  *(undefined8 *)&(this->p).super_Tuple3<pbrt::Point3,_float>.z = 0;
  (this->n).super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  (this->n).super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  (this->ns).super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  (this->ns).super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  (this->n).super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  (this->n).super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  (this->ns).super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  (this->ns).super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  *(undefined8 *)&(this->ns).super_Tuple3<pbrt::Normal3,_float>.z = 0;
  this->dzdx = 0.0;
  this->dzdy = 0.0;
  uVar1 = *(undefined8 *)((albedo->values).values + 2);
  *(undefined8 *)(this->albedo).values.values = *(undefined8 *)(albedo->values).values;
  *(undefined8 *)((this->albedo).values.values + 2) = uVar1;
  this->set = true;
  auVar9 = (undefined1  [56])0x0;
  CameraTransform::CameraFromRender(&local_a8,cameraTransform,(si->super_Interaction).time);
  PVar10 = Interaction::p(&si->super_Interaction);
  local_b8.z = PVar10.super_Tuple3<pbrt::Point3,_float>.z;
  auVar2._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_56_ = auVar9;
  local_b8._0_8_ = vmovlps_avx(auVar2._0_16_);
  PVar11 = Transform::operator()(&local_a8,(Point3<float> *)&local_b8);
  auVar3._0_8_ = PVar11.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar9;
  uVar1 = vmovlps_avx(auVar3._0_16_);
  (this->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (this->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->p).super_Tuple3<pbrt::Point3,_float>.z = PVar11.super_Tuple3<pbrt::Point3,_float>.z;
  VVar12 = Transform::operator()(&local_a8,&(si->super_Interaction).wo);
  local_b8.z = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar9;
  local_b8._0_8_ = vmovlps_avx(auVar4._0_16_);
  NVar13 = Transform::operator()(&local_a8,&(si->super_Interaction).n);
  local_c8.z = NVar13.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar5._0_8_ = NVar13.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar5._8_56_ = auVar9;
  local_c8._0_8_ = vmovlps_avx(auVar5._0_16_);
  NVar13 = FaceForward<float>((Normal3<float> *)&local_c8,(Vector3<float> *)&local_b8);
  auVar6._0_8_ = NVar13.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar6._8_56_ = auVar9;
  uVar1 = vmovlps_avx(auVar6._0_16_);
  (this->n).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (this->n).super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->n).super_Tuple3<pbrt::Normal3,_float>.z = NVar13.super_Tuple3<pbrt::Normal3,_float>.z;
  NVar13 = Transform::operator()(&local_a8,&(si->shading).n);
  local_c8.z = NVar13.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar7._0_8_ = NVar13.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar7._8_56_ = auVar9;
  local_c8._0_8_ = vmovlps_avx(auVar7._0_16_);
  NVar13 = FaceForward<float>((Normal3<float> *)&local_c8,(Vector3<float> *)&local_b8);
  auVar8._0_8_ = NVar13.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar8._8_56_ = auVar9;
  uVar1 = vmovlps_avx(auVar8._0_16_);
  (this->ns).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (this->ns).super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->ns).super_Tuple3<pbrt::Normal3,_float>.z = NVar13.super_Tuple3<pbrt::Normal3,_float>.z;
  this->time = (si->super_Interaction).time;
  VVar12 = Transform::operator()(&local_a8,&si->dpdx);
  this->dzdx = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  VVar12 = Transform::operator()(&local_a8,&si->dpdy);
  this->dzdy = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  return;
}

Assistant:

VisibleSurface::VisibleSurface(const SurfaceInteraction &si,
                               const CameraTransform &cameraTransform,
                               const SampledSpectrum &albedo,
                               const SampledWavelengths &lambda)
    : albedo(albedo) {
    set = true;
    // Initialize geometric _VisibleSurface_ members
    Transform cameraFromRender = cameraTransform.CameraFromRender(si.time);
    p = cameraFromRender(si.p());
    Vector3f wo = cameraFromRender(si.wo);
    n = FaceForward(cameraFromRender(si.n), wo);
    ns = FaceForward(cameraFromRender(si.shading.n), wo);
    time = si.time;
    dzdx = cameraFromRender(si.dpdx).z;
    dzdy = cameraFromRender(si.dpdy).z;
}